

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void preprocess_signed(aec_stream *strm)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  internal_state *piVar6;
  uint *puVar7;
  uint32_t *puVar8;
  ulong uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  
  piVar6 = strm->state;
  puVar7 = piVar6->data_raw;
  puVar8 = piVar6->data_pp;
  uVar1 = piVar6->xmin;
  uVar2 = strm->block_size;
  uVar3 = strm->rsi;
  uVar4 = piVar6->xmax;
  uVar12 = strm->bits_per_sample;
  piVar6->ref = 1;
  piVar6->ref_sample = *puVar7;
  *puVar8 = 0;
  uVar12 = (uint)(1L << ((char)uVar12 - 1U & 0x3f));
  *puVar7 = (*puVar7 ^ uVar12) - uVar12;
  uVar9 = 0;
  do {
    if (uVar2 * uVar3 - 1 == uVar9) {
      piVar6->uncomp_len = (strm->block_size - 1) * strm->bits_per_sample;
      return;
    }
    uVar10 = (puVar7[uVar9 + 1] ^ uVar12) - uVar12;
    puVar7[uVar9 + 1] = uVar10;
    uVar5 = puVar7[uVar9];
    if ((int)uVar10 < (int)uVar5) {
      if (uVar4 - uVar5 < uVar5 - uVar10) {
        uVar11 = uVar4 - uVar10;
        goto LAB_0011cfdc;
      }
      uVar11 = (uVar5 - uVar10) * 2 - 1;
LAB_0011cfd4:
      puVar8[uVar9 + 1] = uVar11;
    }
    else {
      if (uVar5 - uVar1 < uVar10 - uVar5) {
        uVar11 = uVar10 - uVar1;
        goto LAB_0011cfd4;
      }
      uVar11 = (uVar10 - uVar5) * 2;
LAB_0011cfdc:
      puVar8[uVar9 + 1] = uVar11;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static void preprocess_signed(struct aec_stream *strm)
{
    /**
       Preprocess RSI of signed samples.
    */

    uint32_t D;
    struct internal_state *state = strm->state;
    int32_t *restrict x = (int32_t *)state->data_raw;
    uint32_t *restrict d = state->data_pp;
    int32_t xmax = (int32_t)state->xmax;
    int32_t xmin = (int32_t)state->xmin;
    uint32_t rsi = strm->rsi * strm->block_size - 1;
    uint32_t m = UINT64_C(1) << (strm->bits_per_sample - 1);

    state->ref = 1;
    state->ref_sample = x[0];
    d[0] = 0;
    x[0] = (x[0] ^ m) - m;

    for (size_t i = 0; i < rsi; i++) {
        x[i + 1] = (x[i + 1] ^ m) - m;
        if (x[i + 1] < x[i]) {
            D = (uint32_t)(x[i] - x[i + 1]);
            if (D <= (uint32_t)(xmax - x[i]))
                d[i + 1] = 2 * D - 1;
            else
                d[i + 1] = xmax - x[i + 1];
        } else {
            D = (uint32_t)(x[i + 1] - x[i]);
            if (D <= (uint32_t)(x[i] - xmin))
                d[i + 1] = 2 * D;
            else
                d[i + 1] = x[i + 1] - xmin;
        }
    }
    state->uncomp_len = (strm->block_size - 1) * strm->bits_per_sample;
}